

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O2

ssize_t __thiscall notch::io::CSVReader::read(CSVReader *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var2;
  ulong uVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  CSVReader *this_00;
  pointer __src;
  long lVar5;
  int in_R8D;
  int in_R9D;
  long lVar6;
  ulong uVar7;
  pointer __x;
  vector<float,_std::allocator<float>_> row;
  Output label;
  Input data;
  NumericTable numericRows;
  MixedTable mixedRows;
  TextTable rows;
  _Vector_base<float,_std::allocator<float>_> local_b8;
  valarray<float> local_a0;
  vector<float,_std::allocator<float>_> *local_90;
  valarray<float> local_88;
  NumericTable local_78;
  MixedTable local_60;
  TextTable local_48;
  
  this_00 = (CSVReader *)CONCAT44(in_register_00000034,__fd);
  *(undefined8 *)(this + 3) = 0;
  this[3].inPtr = (istream *)0x0;
  *(undefined8 *)(this + 2) = 0;
  this[2].inPtr = (istream *)0x0;
  *(undefined8 *)(this + 1) = 0;
  this[1].inPtr = (istream *)0x0;
  *(undefined8 *)this = 0;
  this->inPtr = (istream *)0x0;
  *(undefined8 *)(this + 4) = 0;
  readCSV_abi_cxx11_(&local_48,this_00,(istream *)__buf,in_R8D,in_R9D);
  convertToMixed(&local_60,this_00,&local_48);
  convertToNumeric(&local_78,this_00,&local_60);
  local_90 = local_78.
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = local_78.
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __x != local_90; __x = __x + 1) {
    core::std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&local_b8,__x);
    core::std::valarray<float>::valarray(&local_a0,*(long *)(__nbytes + 8) - *(long *)__nbytes >> 2)
    ;
    uVar4 = (long)local_b8._M_impl.super__Vector_impl_data._M_finish -
            (long)local_b8._M_impl.super__Vector_impl_data._M_start >> 2;
    lVar5 = *(long *)__nbytes;
    lVar1 = *(long *)(__nbytes + 8);
    for (lVar6 = 0; lVar1 - lVar5 >> 2 != lVar6; lVar6 = lVar6 + 1) {
      local_a0._M_data[lVar6] =
           local_b8._M_impl.super__Vector_impl_data._M_start
           [((long)*(int *)(lVar5 + lVar6 * 4) + uVar4) % uVar4];
    }
    uVar7 = uVar4 & 0xffffffff;
    while( true ) {
      uVar7 = uVar7 - 1;
      if ((int)(uint)uVar7 < 0) break;
      _Var2 = std::
              __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<notch::io::CSVReader::read(std::istream&,std::vector<int,std::allocator<int>>,int,int)::_lambda(int)_1_>>
                        (*(undefined8 *)__nbytes,*(undefined8 *)(__nbytes + 8),uVar4,
                         uVar7 & 0xffffffff);
      if (_Var2._M_current != *(int **)(__nbytes + 8)) {
        uVar3 = (ulong)((uint)uVar7 & 0x7fffffff);
        __src = local_b8._M_impl.super__Vector_impl_data._M_start + uVar3 + 1;
        if (__src != local_b8._M_impl.super__Vector_impl_data._M_finish) {
          memmove(local_b8._M_impl.super__Vector_impl_data._M_start + uVar3,__src,
                  (long)local_b8._M_impl.super__Vector_impl_data._M_finish - (long)__src);
        }
        local_b8._M_impl.super__Vector_impl_data._M_finish =
             local_b8._M_impl.super__Vector_impl_data._M_finish + -1;
      }
    }
    core::std::valarray<float>::valarray
              (&local_88,
               (long)local_b8._M_impl.super__Vector_impl_data._M_finish -
               (long)local_b8._M_impl.super__Vector_impl_data._M_start >> 2);
    for (lVar5 = 0;
        (long)local_b8._M_impl.super__Vector_impl_data._M_finish -
        (long)local_b8._M_impl.super__Vector_impl_data._M_start >> 2 != lVar5; lVar5 = lVar5 + 1) {
      local_88._M_data[lVar5] = local_b8._M_impl.super__Vector_impl_data._M_start[lVar5];
    }
    core::LabeledDataset::append((LabeledDataset *)this,&local_88,&local_a0);
    operator_delete(local_88._M_data);
    operator_delete(local_a0._M_data);
    core::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_b8);
  }
  core::std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_78);
  core::std::
  vector<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>,_std::allocator<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_>_>
  ::~vector(&local_60);
  core::std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_48);
  return (ssize_t)this;
}

Assistant:

LabeledDataset
    read(std::istream &in, std::vector<int> labelcols = {-1},
         int skiprows=0, int skipcols=0) {
        LabeledDataset ds;
        auto rows = readCSV(in, skiprows, skipcols);
        auto mixedRows = convertToMixed(rows);
        auto numericRows = convertToNumeric(mixedRows);
        for (auto row : numericRows) {
            // build label vector
            Output label(labelcols.size());
            size_t ncols = row.size();
            for (size_t i = 0; i < labelcols.size(); ++i) {
                size_t colIdx = ((ncols + labelcols[i]) % ncols);
                label[i] = row[colIdx];
            }
            // remove label columns from the row (from the end)
            for (int i = row.size()-1; i >= 0; --i) {
                auto found = std::find_if(labelcols.begin(), labelcols.end(),
                             [=](int labelcol) {
                                return (labelcol + ncols) % ncols == size_t(i);
                             });
                if (found != labelcols.end()) {
                    row.erase(row.begin() + i);
                }
            }
            // build data vector
            Input data(row.size());
            for (size_t i = 0; i < row.size(); ++i) {
                data[i] = row[i];
            }
            ds.append(data, label);
        }
        return ds;
    }